

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

istream * operator>>(istream *stream,BupHeader *header)

{
  pointer pBVar1;
  pointer src;
  uint uVar2;
  endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> eVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  size_t len;
  pointer pBVar7;
  BupChunk *mouth;
  ulong uVar8;
  pointer pBVar9;
  BupChunk *chunk;
  BupChunkV4 BVar10;
  vector<char,_std::allocator<char>_> nameBuf;
  BupExpressionChunkV4 c;
  BupHeaderV4 h;
  _Vector_base<char,_std::allocator<char>_> local_c8;
  BupExpressionChunkV4 local_b0;
  string local_90;
  BupHeaderV4 local_70;
  
  uVar2 = detectSwitch(stream);
  if ((int)uVar2 < 0) {
    readBup<BupHeaderPS3>(stream,header);
  }
  else if (uVar2 < 4) {
    readBup<BupHeaderSwitch>(stream,header);
  }
  else {
    header->isSwitch = true;
    readRaw<BupHeaderV4>(&local_70,stream);
    header->ew = (uint16_t)local_70.ew.value_;
    header->eh = (uint16_t)local_70.eh.value_;
    header->width = (uint16_t)local_70.width.value_;
    header->height = (uint16_t)local_70.height.value_;
    eVar3 = readRaw<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>>
                      (stream);
    std::vector<BupChunk,_std::allocator<BupChunk>_>::resize
              (&header->chunks,(ulong)(uint)eVar3.value_);
    pBVar1 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar9 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
                  super__Vector_impl_data._M_start; pBVar9 != pBVar1; pBVar9 = pBVar9 + 1) {
      BVar10 = readRaw<BupChunkV4>(stream);
      pBVar9->offset = (uint32_t)BVar10.offset.value_.value_;
    }
    while( true ) {
      uVar4 = std::istream::tellg();
      eVar3 = readRaw<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>>
                        (stream);
      if ((uVar4 & 0xf) == 0) break;
      if (eVar3.value_ != (uchar  [4])0x0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Unexpected nonzero values in header");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::resize
              (&header->expChunks,(ulong)(uint)eVar3.value_);
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar4 = 0;
        pBVar7 = (header->expChunks).
                 super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl
                 .super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(header->expChunks).
                              super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar7 >> 6);
        uVar4 = uVar4 + 1) {
      readRaw<BupExpressionChunkV4>(&local_b0,stream);
      pBVar7 = pBVar7 + uVar4;
      (pBVar7->face).offset = (uint32_t)local_b0.face.offset.value_;
      uVar8 = (ulong)(uint)local_b0.headerLen.value_;
      uVar6 = (ulong)(uint)local_b0.numMouths.value_;
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)&local_c8,(uVar8 + uVar6 * -0xc) - 0x1f);
      local_c8._M_impl.super__Vector_impl_data._M_start[uVar8 + uVar6 * -0xc + -0x20] = '\0';
      std::istream::read((char *)stream,(long)local_c8._M_impl.super__Vector_impl_data._M_start);
      src = local_c8._M_impl.super__Vector_impl_data._M_start;
      len = strlen(local_c8._M_impl.super__Vector_impl_data._M_start);
      toUTF8_abi_cxx11_(&local_90,src,len);
      std::__cxx11::string::operator=((string *)pBVar7,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::vector<BupChunk,_std::allocator<BupChunk>_>::resize
                (&pBVar7->mouths,(ulong)(uint)local_b0.numMouths.value_);
      pBVar1 = *(pointer *)
                ((long)&(pBVar7->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                        _M_impl + 8);
      for (pBVar9 = *(pointer *)
                     &(pBVar7->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                      _M_impl; pBVar9 != pBVar1; pBVar9 = pBVar9 + 1) {
        BVar10 = readRaw<BupChunkV4>(stream);
        pBVar9->offset = (uint32_t)BVar10.offset.value_.value_;
      }
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_c8);
  }
  return stream;
}

Assistant:

std::istream& operator>> (std::istream& stream, BupHeader &header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readBup<BupHeaderPS3>(stream, header);
	} else if (version < 4) { // Switch Old
		readBup<BupHeaderSwitch>(stream, header);
	} else { // Switch New
		header.isSwitch = true;
		auto h = readRaw<BupHeaderV4>(stream);
		header.eh = h.eh.value();
		header.ew = h.ew.value();
		header.width = h.width.value();
		header.height = h.height.value();
		auto numChunks = readRaw<uint32_le>(stream);
		header.chunks.resize(numChunks.value());

		for (auto& chunk : header.chunks) {
			auto c = readRaw<BupChunkV4>(stream);
			copyTo(chunk, c);
		}

		while (stream.tellg() % 16 != 0) {
			auto t = readRaw<uint32_le>(stream);
			if (t.value() != 0) {
				std::cerr << "Unexpected nonzero values in header" << std::endl;
			}
		}

		auto numExpChunks = readRaw<uint32_le>(stream);
		header.expChunks.resize(numExpChunks.value());
		std::vector<char> nameBuf;

		for (size_t i = 0; i < header.expChunks.size(); i++) {
			auto& expChunk = header.expChunks[i];
			auto c = readRaw<BupExpressionChunkV4>(stream);
			copyTo(expChunk.face, c.face);
			auto namelen = c.headerLen.value() - sizeof(c) - c.numMouths.value() * sizeof(BupChunkV4);
			nameBuf.resize(namelen + 1);
			nameBuf[namelen] = 0;
			stream.read(nameBuf.data(), namelen);
			expChunk.name = toUTF8(nameBuf.data(), strlen(nameBuf.data()));

			expChunk.mouths.resize(c.numMouths.value());
			for (auto& mouth : expChunk.mouths) {
				auto m = readRaw<BupChunkV4>(stream);
				copyTo(mouth, m);
			}
		}
	}
	return stream;
}